

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_vc.c
# Opt level: O1

_Bool clnt_vc_control(CLIENT *clnt,u_int request,void *info)

{
  ushort *puVar1;
  clnt_ops *pcVar2;
  uint uVar3;
  _Bool _Var4;
  
  pcVar2 = clnt[1].cl_ops;
  if (((byte)__ntirpc_pkg_params.debug_flags & 8) != 0) {
    if (*(int *)&pcVar2[0x17].cl_freeres == 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%d locking","clnt_vc_control",0x165);
    }
    else {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%d locking @%s:%d","clnt_vc_control",0x165,pcVar2[0x17].cl_abort);
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)(pcVar2 + 0x15));
  pcVar2[0x17].cl_abort = (_func_void_rpc_client_ptr *)"clnt_vc_control";
  *(undefined4 *)&pcVar2[0x17].cl_freeres = 0x165;
  pthread_mutex_lock((pthread_mutex_t *)&clnt->cl_lock);
  if (request == 9) {
    LOCK();
    puVar1 = (ushort *)((long)&pcVar2[10].cl_destroy + 4);
    *puVar1 = *puVar1 & 0xffef;
    UNLOCK();
    goto LAB_0010e63c;
  }
  if (request == 8) {
    LOCK();
    puVar1 = (ushort *)((long)&pcVar2[10].cl_destroy + 4);
    *puVar1 = *puVar1 | 0x10;
    UNLOCK();
    goto LAB_0010e63c;
  }
  if (info == (void *)0x0) {
    _Var4 = false;
    goto switchD_0010e6c1_caseD_4;
  }
  _Var4 = false;
  switch(request) {
  case 3:
    memcpy(info,&clnt[1].cl_lock,(long)*(int *)((long)&clnt[2].cl_lock + 0x18));
    break;
  default:
    goto switchD_0010e6c1_caseD_4;
  case 6:
    uVar3 = *(uint *)&pcVar2[10].cl_abort;
    goto LAB_0010e73a;
  case 7:
    *(pthread_mutex_t **)((long)info + 8) = &clnt[1].cl_lock;
    *(undefined4 *)((long)info + 4) = *(undefined4 *)((long)&clnt[2].cl_lock + 0x18);
    *(undefined4 *)info = 0x80;
    break;
  case 10:
    uVar3 = *(uint *)&clnt[1].cl_netid;
    goto LAB_0010e738;
  case 0xb:
    uVar3 = *info - 1;
    *(uint *)&pcVar2[0x19].cl_abort =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
    break;
  case 0xc:
    uVar3 = *(uint *)&clnt[1].cl_u1;
    goto LAB_0010e738;
  case 0xd:
    uVar3 = *info;
    *(uint *)&clnt[1].cl_u1 =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    break;
  case 0xe:
    uVar3 = *(uint *)((long)&clnt[1].cl_tp + 4);
LAB_0010e738:
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_0010e73a:
    *(uint *)info = uVar3;
    break;
  case 0xf:
    uVar3 = *info;
    *(uint *)((long)&clnt[1].cl_tp + 4) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
LAB_0010e63c:
  _Var4 = true;
switchD_0010e6c1_caseD_4:
  if (((byte)__ntirpc_pkg_params.debug_flags & 8) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%d unlocking @%s:%d","clnt_vc_control",0x1c2,pcVar2[0x17].cl_abort,
               (ulong)*(uint *)&pcVar2[0x17].cl_freeres);
  }
  *(undefined4 *)&pcVar2[0x17].cl_freeres = 0;
  pthread_mutex_unlock((pthread_mutex_t *)(pcVar2 + 0x15));
  pthread_mutex_unlock((pthread_mutex_t *)&clnt->cl_lock);
  return _Var4;
}

Assistant:

static bool
clnt_vc_control(CLIENT *clnt, u_int request, void *info)
{
	struct cx_data *cx = CX_DATA(clnt);
	struct ct_data *ct = CT_DATA(cx);
	struct rpc_dplx_rec *rec = cx->cx_rec;
	struct netbuf *addr;
	u_int32_t *uint32p;
	bool rslt = true;

	/* always take recv lock first if taking together */
	rpc_dplx_rli(rec);
	mutex_lock(&clnt->cl_lock);

	/*
	 * By default, SVC_XPRT_FLAG_CLOSE is always false. It is user
	 * responsibility to do a close on the fd, or set by cl_control.
	 */
	switch (request) {
	case CLSET_FD_CLOSE:
		(void)atomic_set_uint16_t_bits(&rec->xprt.xp_flags,
						SVC_XPRT_FLAG_CLOSE);
		goto unlock;
	case CLSET_FD_NCLOSE:
		(void)atomic_clear_uint16_t_bits(&rec->xprt.xp_flags,
						SVC_XPRT_FLAG_CLOSE);
		goto unlock;
	default:
		break;
	}

	/* for other requests which use info */
	if (info == NULL) {
		rslt = false;
		goto unlock;
	}
	switch (request) {
	case CLGET_SERVER_ADDR:
		/* Now obsolete. Only for backward compatibility */
		(void)memcpy(info, &ct->ct_raddr, (size_t) ct->ct_rlen);
		break;
	case CLGET_FD:
		*(int *)info = rec->xprt.xp_fd;
		break;
	case CLGET_SVC_ADDR:
		/* The caller should not free this memory area */
		addr = (struct netbuf *)info;
		addr->buf = &ct->ct_raddr;
		addr->len = ct->ct_rlen;
		addr->maxlen = sizeof(ct->ct_raddr);
		break;

	case CLGET_XID:
		/*
		 * use the knowledge that xid is the
		 * first element in the call structure
		 * This will get the xid of the PREVIOUS call
		 */
		uint32p = (u_int32_t *)&cx->cx_mcallc[0];
		*(u_int32_t *)info = ntohl(*uint32p);
		break;

	case CLSET_XID:
		/* This will set the xid of the NEXT call */
		rec->call_xid = htonl(*(u_int32_t *) info - 1);
		/* decrement by 1 as clnt_req_setup() increments once */
		break;

	case CLGET_VERS:
		/*
		 * This RELIES on the information that, in the call body,
		 * the version number field is the fifth field from the
		 * beginning of the RPC header.
		 */
		uint32p = (u_int32_t *)&cx->cx_mcallc[4 * BYTES_PER_XDR_UNIT];
		*(u_int32_t *)info = ntohl(*uint32p);
		break;

	case CLSET_VERS:
		uint32p = (u_int32_t *)&cx->cx_mcallc[4 * BYTES_PER_XDR_UNIT];
		*uint32p = htonl(*(u_int32_t *)info);
		break;

	case CLGET_PROG:
		/*
		 * This RELIES on the information that, in the call body,
		 * the program number field is the fourth field from the
		 * beginning of the RPC header.
		 */
		uint32p = (u_int32_t *)&cx->cx_mcallc[3 * BYTES_PER_XDR_UNIT];
		*(u_int32_t *)info = ntohl(*uint32p);
		break;

	case CLSET_PROG:
		uint32p = (u_int32_t *)&cx->cx_mcallc[3 * BYTES_PER_XDR_UNIT];
		*uint32p = htonl(*(u_int32_t *)info);
		break;

	default:
		rslt = false;
		break;
	}

 unlock:
	rpc_dplx_rui(rec);
	mutex_unlock(&clnt->cl_lock);

	return (rslt);
}